

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O2

jsgf_rule_t * jsgf_get_public_rule(jsgf_t *grammar)

{
  char *__s;
  jsgf_rule_t *pjVar1;
  char *pcVar2;
  int iVar3;
  jsgf_rule_iter_t *itor;
  char *pcVar4;
  
  itor = jsgf_rule_iter(grammar);
  do {
    if (itor == (hash_iter_t *)0x0) {
      return (jsgf_rule_t *)0x0;
    }
    pjVar1 = (jsgf_rule_t *)itor->ent->val;
    if (pjVar1->is_public != 0) {
      pcVar2 = pjVar1->name;
      __s = pcVar2 + 1;
      pcVar4 = strrchr(__s,0x2e);
      if ((pcVar4 == (char *)0x0) ||
         (iVar3 = strncmp(__s,grammar->name,(size_t)(pcVar4 + ~(ulong)pcVar2)), iVar3 == 0)) {
        hash_table_iter_free(itor);
        return pjVar1;
      }
    }
    itor = hash_table_iter_next(itor);
  } while( true );
}

Assistant:

jsgf_rule_t *
jsgf_get_public_rule(jsgf_t * grammar)
{
    jsgf_rule_iter_t *itor;
    jsgf_rule_t *public_rule = NULL;

    for (itor = jsgf_rule_iter(grammar); itor;
         itor = jsgf_rule_iter_next(itor)) {
        jsgf_rule_t *rule = jsgf_rule_iter_rule(itor);
        if (jsgf_rule_public(rule)) {
            const char *rule_name = jsgf_rule_name(rule);
            char *dot_pos;
            if ((dot_pos = strrchr(rule_name + 1, '.')) == NULL) {
                public_rule = rule;
                jsgf_rule_iter_free(itor);
                break;
            }
            if (0 ==
                strncmp(rule_name + 1, jsgf_grammar_name(grammar),
                        dot_pos - rule_name - 1)) {
                public_rule = rule;
                jsgf_rule_iter_free(itor);
                break;
            }
        }
    }
    return public_rule;
}